

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O0

int fftscl(fitsfile *fptr,int colnum,double scale,double zero,int *status)

{
  int iVar1;
  long lVar2;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int hdutype;
  tcolumn *colptr;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  fitsfile *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if (*in_RDX < 1) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      iVar1 = ffghdt(in_stack_ffffffffffffffc8,
                     (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
      if (iVar1 < 1) {
        if (in_stack_ffffffffffffffc4 == 0) {
          *in_RDX = 0xeb;
          local_4 = 0xeb;
        }
        else {
          lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x3d0) + (long)(in_ESI + -1) * 0xa0;
          *(double *)(lVar2 + 0x60) = in_XMM0_Qa;
          *(ulong *)(lVar2 + 0x68) = CONCAT44(in_XMM1_Db,in_XMM1_Da);
          local_4 = *in_RDX;
        }
      }
      else {
        local_4 = *in_RDX;
      }
    }
    else {
      *in_RDX = 0x142;
      local_4 = 0x142;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int fftscl(fitsfile *fptr,      /* I - FITS file pointer */
           int colnum,          /* I - column number to apply scaling to */
           double scale,        /* I - scaling factor: value of TSCALn   */
           double zero,         /* I - zero point: value of TZEROn       */
           int *status)         /* IO - error status     */
/*
  Define the linear scaling factor for the TABLE or BINTABLE extension
  column values. This routine overrides the scaling values given by the
  TSCALn and TZEROn keywords if present.  Note that this routine does not
  write or modify the TSCALn and TZEROn keywords, but instead only modifies
  the values temporarily in the internal buffer.  Thus, a subsequent call to
  the ffrdef routine will reset the scaling back to the TSCALn and TZEROn
  keyword values (or 1. and 0. respectively if the keywords are not present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (scale == 0)
        return(*status = ZERO_SCALE);  /* zero scale value is illegal */

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype == IMAGE_HDU)
        return(*status = NOT_TABLE);         /* not proper HDU type */

    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);     /* increment to the correct column */

    colptr->tscale = scale;
    colptr->tzero = zero;

    return(*status);
}